

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbo.cpp
# Opt level: O3

void __thiscall vera::Vbo::addIndices(Vbo *this,GLuint *_indices,int _nIndices)

{
  if (this->m_isUploaded == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Vbo cannot add indices after upload!",0x24);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
    return;
  }
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_insert<unsigned_int*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->m_indices,
             (this->m_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish,_indices,_indices + _nIndices);
  this->m_nIndices = this->m_nIndices + _nIndices;
  return;
}

Assistant:

void Vbo::addIndices(INDEX_TYPE_GL* _indices, int _nIndices) {
    if (m_isUploaded) {
        std::cout << "Vbo cannot add indices after upload!" << std::endl;
        return;
    }

    // if (m_nVertices >= MAX_INDEX_VALUE) {
    //     std::cout << "WARNING: Vertex buffer full, not adding indices" << std::endl;
    //     return;
    // }

    m_indices.insert(m_indices.end(), _indices, _indices + _nIndices);
    m_nIndices += _nIndices;
}